

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

void learn(log_multi *b,single_learner *base,example *ec)

{
  uint32_t *puVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  uint32_t in_R9D;
  ulong uVar5;
  uint32_t cn;
  uint32_t class_index;
  uint32_t local_50;
  uint32_t local_44;
  single_learner *local_40;
  uint32_t local_34;
  
  local_50 = (ec->l).multi.label;
  local_40 = base;
  if ((local_50 == 0xffffffff) || (b->progress == true)) {
    predict(b,base,ec);
    local_50 = (ec->l).multi.label;
    if (local_50 == 0xffffffff) {
      return;
    }
  }
  fVar2 = (ec->l).simple.weight;
  fVar3 = (ec->pred).scalar;
  local_34 = 0;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  local_44 = 0;
  uVar5 = 0;
  while (bVar4 = children(b,&local_44,&local_34,local_50), bVar4) {
    train_node(b,local_40,ec,&local_44,&local_34,in_R9D);
    local_44 = (&(b->nodes)._begin[uVar5].left)[0.0 < (ec->pred).scalar || (ec->pred).scalar == 0.0]
    ;
    uVar5 = (ulong)local_44;
  }
  puVar1 = &(b->nodes)._begin[uVar5].min_count;
  *puVar1 = *puVar1 + 1;
  update_min_count(b,(uint32_t)uVar5);
  (ec->pred).scalar = fVar3;
  (ec->l).multi.label = local_50;
  (ec->l).simple.weight = fVar2;
  return;
}

Assistant:

void learn(log_multi& b, single_learner& base, example& ec)
{
  //    verify_min_dfs(b, b.nodes[0]);
  if (ec.l.multi.label == (uint32_t)-1 || b.progress)
    predict(b, base, ec);

  if (ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    MULTICLASS::label_t mc = ec.l.multi;
    uint32_t start_pred = ec.pred.multiclass;

    uint32_t class_index = 0;
    ec.l.simple = {FLT_MAX, 0.f, 0.f};
    uint32_t cn = 0;
    uint32_t depth = 0;
    while (children(b, cn, class_index, mc.label))
    {
      train_node(b, base, ec, cn, class_index, depth);
      cn = descend(b.nodes[cn], ec.pred.scalar);
      depth++;
    }

    b.nodes[cn].min_count++;
    update_min_count(b, cn);
    ec.pred.multiclass = start_pred;
    ec.l.multi = mc;
  }
}